

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_lib.c
# Opt level: O1

EC_GROUP * EC_GROUP_new(EC_METHOD *meth)

{
  int iVar1;
  EC_GROUP *ptr;
  BIGNUM *pBVar2;
  
  if (meth == (EC_METHOD *)0x0) {
    return (EC_GROUP *)0x0;
  }
  if (*(long *)(meth + 8) == 0) {
    return (EC_GROUP *)0x0;
  }
  ptr = (EC_GROUP *)CRYPTO_zalloc(0x58);
  if (ptr == (EC_GROUP *)0x0) {
    return (EC_GROUP *)0x0;
  }
  *(EC_METHOD **)ptr = meth;
  if (((byte)*meth & 2) == 0) {
    pBVar2 = BN_new();
    *(BIGNUM **)(ptr + 0x10) = pBVar2;
    if (pBVar2 == (BIGNUM *)0x0) goto LAB_001160e7;
  }
  iVar1 = (**(code **)(meth + 8))(ptr);
  if (iVar1 != 0) {
    return ptr;
  }
LAB_001160e7:
  BN_free(*(BIGNUM **)(ptr + 0x10));
  CRYPTO_free(ptr);
  return (EC_GROUP *)0x0;
}

Assistant:

EC_GROUP *EC_GROUP_new(const EC_METHOD *meth)
{
    EC_GROUP *ret;

    if (meth == NULL) {
        //ECerr(EC_F_EC_GROUP_NEW, EC_R_SLOT_FULL);
        return NULL;
    }
    if (meth->group_init == 0) {
        //ECerr(EC_F_EC_GROUP_NEW, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
        return NULL;
    }

    ret = CRYPTO_zalloc(sizeof(*ret));
    if (ret == NULL) {
        //ECerr(EC_F_EC_GROUP_NEW, ERR_R_MALLOC_FAILURE);
        return NULL;
    }

    ret->meth = meth;
    if ((ret->meth->flags & EC_FLAGS_CUSTOM_CURVE) == 0) {
        ret->order = BN_new();
        if (ret->order == NULL)
            goto err;
    }
    if (!meth->group_init(ret))
        goto err;
    return ret;

err:
    BN_free(ret->order);
    // BN_free(ret->cofactor);
    CRYPTO_free(ret);
    return NULL;
}